

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O1

void nes_apu_update(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  DEV_SMPL *pDVar4;
  DEV_SMPL *pDVar5;
  uint uVar6;
  char cVar7;
  byte bVar8;
  undefined2 uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  byte bVar13;
  sbyte sVar14;
  char cVar15;
  byte bVar16;
  int iVar17;
  byte bVar18;
  ulong uVar19;
  short sVar20;
  uint uVar21;
  nesapu_state *info;
  float fVar22;
  
  if (samples != 0) {
    pDVar4 = *outputs;
    pDVar5 = outputs[1];
    uVar19 = 0;
    do {
      apu_square((nesapu_state *)chip,(square_t *)((long)chip + 8));
      apu_square((nesapu_state *)chip,(square_t *)((long)chip + 0x30));
      if ((*(char *)((long)chip + 0x72) == '\x01') && (*(char *)((long)chip + 0x74) != '\x01')) {
        bVar8 = *(byte *)((long)chip + 0x58);
        if ((~*(byte *)((long)chip + 0x71) & -1 < (char)bVar8) == 1) {
          if (*(int *)((long)chip + 0x68) != 0) {
            *(int *)((long)chip + 0x68) = *(int *)((long)chip + 0x68) + -1;
          }
          if (*(int *)((long)chip + 0x68) == 0) {
            *(undefined1 *)((long)chip + 0x71) = 1;
          }
        }
        if (*(char *)((long)chip + 0x71) == '\x01') {
          if (*(char *)((long)chip + 0x60) == '\x01') {
            iVar11 = *(int *)((long)chip + (ulong)(bVar8 & 0x7f) * 4 + 0x208);
LAB_001600fe:
            *(int *)((long)chip + 0x5c) = iVar11;
          }
          else if (0 < *(int *)((long)chip + 0x5c)) {
            iVar11 = *(int *)((long)chip + 0x5c) + -1;
            goto LAB_001600fe;
          }
          if (-1 < (char)bVar8) {
            *(undefined1 *)((long)chip + 0x60) = 0;
          }
          if (*(int *)((long)chip + 100) != 0 && -1 < (char)bVar8) {
            *(int *)((long)chip + 100) = *(int *)((long)chip + 100) + -1;
          }
        }
        if ((*(int *)((long)chip + 0x5c) != 0) && (*(int *)((long)chip + 100) != 0)) {
          iVar11 = (*(byte *)((long)chip + 0x5b) & 7) * 0x100;
          if (2 < iVar11 + (uint)*(byte *)((long)chip + 0x5a)) {
            fVar22 = *(float *)((long)chip + 0x6c) - *(float *)((long)chip + 0xfc);
            *(float *)((long)chip + 0x6c) = fVar22;
            if (fVar22 < 0.0) {
              bVar8 = *(byte *)((long)chip + 0x70);
              do {
                fVar22 = fVar22 + (float)(iVar11 + (uint)*(byte *)((long)chip + 0x5a) + 1);
                bVar13 = bVar8 + 1;
                bVar8 = bVar13 & 0x1f;
              } while (fVar22 < 0.0);
              bVar18 = bVar13 & 0xf ^ 7;
              if ((bVar13 & 8) == 0) {
                bVar18 = bVar13 & 0xf | 8;
              }
              bVar16 = bVar18 * '\x02' ^ 0x1e;
              if ((bVar13 & 0x10) == 0) {
                bVar16 = bVar18 * '\x02';
              }
              *(float *)((long)chip + 0x6c) = fVar22;
              *(byte *)((long)chip + 0x70) = bVar8;
              *(byte *)((long)chip + 0x73) = bVar16 - 0x10;
            }
            goto LAB_0016014c;
          }
        }
        *(undefined1 *)((long)chip + 0x73) = 0;
      }
      else {
        *(undefined1 *)((long)chip + 0x73) = 0;
      }
LAB_0016014c:
      if ((*(char *)((long)chip + 0x95) == '\x01') && (*(char *)((long)chip + 0x97) != '\x01')) {
        bVar8 = *(byte *)((long)chip + 0x80);
        uVar10 = bVar8 & 0xf;
        iVar11 = *(int *)((long)chip + (ulong)uVar10 * 4 + 0x188);
        fVar22 = *(float *)((long)chip + 0x90) + -4.0;
        *(float *)((long)chip + 0x90) = fVar22;
        if (fVar22 < 0.0) {
          bVar13 = *(byte *)((long)chip + 0x94);
          do {
            if ((bVar8 & 0x20) == 0) {
              if (bVar13 < 0xf) {
                bVar13 = bVar13 + 1;
                goto LAB_001601b8;
              }
            }
            else {
              bVar13 = bVar13 + 1 & 0xf;
LAB_001601b8:
              *(byte *)((long)chip + 0x94) = bVar13;
            }
            fVar22 = fVar22 + (float)iVar11;
          } while (fVar22 < 0.0);
          *(float *)((long)chip + 0x90) = fVar22;
        }
        if (((bVar8 & 0x20) == 0) && (0 < *(int *)((long)chip + 0x88))) {
          *(int *)((long)chip + 0x88) = *(int *)((long)chip + 0x88) + -1;
        }
        if (*(int *)((long)chip + 0x88) == 0) goto LAB_001602af;
        fVar22 = *(float *)((long)chip + 0x8c) - *(float *)((long)chip + 0xfc);
        iVar11 = noise_freq[*(byte *)((long)chip + 0xf8)][*(byte *)((long)chip + 0x82) & 0xf];
        *(float *)((long)chip + 0x8c) = fVar22;
        if (fVar22 < 0.0) {
          uVar21 = (uint)*(ushort *)((long)chip + 0x84);
          sVar14 = ((char)*(byte *)((long)chip + 0x82) < '\0') * '\x05' + 1;
          if (*(char *)((long)chip + 0xfa) != '\0') {
            sVar14 = 1;
          }
          do {
            fVar22 = fVar22 + (float)iVar11;
            uVar21 = (((uVar21 >> sVar14 ^ uVar21) & 1) << 0xf | uVar21) >> 1;
          } while (fVar22 < 0.0);
          *(short *)((long)chip + 0x84) = (short)uVar21;
          *(float *)((long)chip + 0x8c) = fVar22;
        }
        if ((bVar8 & 0x10) == 0) {
          uVar10 = (uint)(byte)(0xf - *(char *)((long)chip + 0x94));
        }
        cVar7 = -(char)uVar10;
        if ((*(ushort *)((long)chip + 0x84) & 1) != 0) {
          cVar7 = (char)uVar10;
        }
        *(char *)((long)chip + 0x96) = cVar7;
      }
      else {
LAB_001602af:
        *(undefined1 *)((long)chip + 0x96) = 0;
      }
      if (*(char *)((long)chip + 0xc3) == '\x01') {
        *(undefined1 *)((long)chip + 0xc2) = 0;
      }
      else {
        if (*(char *)((long)chip + 0xb5) == '\x01') {
          uVar10 = *(uint *)((long)chip + 0xa0);
          fVar22 = *(float *)((long)chip + 0xb0) - *(float *)((long)chip + 0xfc);
          iVar11 = dpcm_clocks[*(byte *)((long)chip + 0xf8)][uVar10 & 0xf];
          *(float *)((long)chip + 0xb0) = fVar22;
          if (fVar22 < 0.0) {
            iVar17 = *(int *)((long)chip + 0xa8);
            do {
              fVar22 = fVar22 + (float)iVar11;
              *(float *)((long)chip + 0xb0) = fVar22;
              if (iVar17 == 0) {
                *(undefined1 *)((long)chip + 0xb5) = 0;
                if ((uVar10 & 0x40) == 0) {
                  if ((char)uVar10 < '\0') {
                    *(undefined1 *)((long)chip + 0xb6) = 1;
                  }
                  break;
                }
                *(uint *)((long)chip + 0xa4) = (uint)*(byte *)((long)chip + 0xa2) << 6 | 0xc000;
                iVar17 = (uint)*(byte *)((long)chip + 0xa3) * 0x10 + 1;
                *(int *)((long)chip + 0xa8) = iVar17;
                *(uint *)((long)chip + 0xac) = (uint)*(byte *)((long)chip + 0xa3) * 0x80 + 8;
                *(undefined2 *)((long)chip + 0xb5) = 1;
              }
              uVar21 = *(int *)((long)chip + 0xac) - 1;
              *(uint *)((long)chip + 0xac) = uVar21;
              uVar21 = uVar21 & 7;
              if (uVar21 == 0) {
                uVar3 = *(uint *)((long)chip + 0xa4);
                uVar6 = uVar3 - 0x7fff;
                if (uVar3 + 1 < 0x10000) {
                  uVar6 = uVar3 + 1;
                }
                *(undefined1 *)((long)chip + 0xb4) =
                     *(undefined1 *)(*(long *)((long)chip + 0xb8) + (ulong)uVar3);
                *(uint *)((long)chip + 0xa4) = uVar6;
                iVar17 = iVar17 + -1;
                *(int *)((long)chip + 0xa8) = iVar17;
              }
              sVar20 = 2;
              if (((*(byte *)((long)chip + 0xb4) >> (uVar21 ^ 7) & 1) != 0) ||
                 (sVar20 = -2, 1 < *(short *)((long)chip + 0xc0))) {
                *(short *)((long)chip + 0xc0) = sVar20 + *(short *)((long)chip + 0xc0);
              }
            } while (fVar22 < 0.0);
          }
        }
        uVar9 = 0x7f;
        if (*(short *)((long)chip + 0xc0) < 0x80) {
          if (*(short *)((long)chip + 0xc0) < 0) {
            uVar9 = 0;
            goto LAB_00160425;
          }
        }
        else {
LAB_00160425:
          *(undefined2 *)((long)chip + 0xc0) = uVar9;
        }
        *(undefined1 *)((long)chip + 0xc2) = *(undefined1 *)((long)chip + 0xc0);
      }
      if (*(char *)((long)chip + 0xf9) == '\0') {
        bVar8 = *(byte *)((long)chip + 0x4b);
        cVar7 = *(char *)((long)chip + 0x73);
        cVar15 = *(char *)((long)chip + 0x96);
        cVar1 = *(char *)((long)chip + 0xc2);
        iVar11 = (int)(short)((ushort)*(byte *)((long)chip + 0x23) << 8);
        pDVar4[uVar19] = *(int *)((long)chip + 0x28) * iVar11 >> 0x10;
        pDVar5[uVar19] = iVar11 * *(int *)((long)chip + 0x2c) >> 0x10;
        iVar11 = (int)(short)((ushort)bVar8 << 8);
        pDVar4[uVar19] = pDVar4[uVar19] + (*(int *)((long)chip + 0x50) * iVar11 >> 0x10);
        pDVar5[uVar19] = pDVar5[uVar19] + (iVar11 * *(int *)((long)chip + 0x54) >> 0x10);
        iVar11 = cVar7 * 0xc00000 >> 0x10;
        pDVar4[uVar19] = pDVar4[uVar19] + (*(int *)((long)chip + 0x78) * iVar11 >> 0x10);
        pDVar5[uVar19] = pDVar5[uVar19] + (iVar11 * *(int *)((long)chip + 0x7c) >> 0x10);
        iVar11 = cVar15 * 0xc00000 >> 0x10;
        pDVar4[uVar19] = pDVar4[uVar19] + (*(int *)((long)chip + 0x98) * iVar11 >> 0x10);
        pDVar5[uVar19] = pDVar5[uVar19] + (iVar11 * *(int *)((long)chip + 0x9c) >> 0x10);
        lVar12 = ((long)cVar1 << 0x36) + ((long)cVar1 << 0x37) >> 0x30;
        pDVar4[uVar19] =
             pDVar4[uVar19] + (int)((ulong)(*(int *)((long)chip + 0xc4) * lVar12) >> 0x10);
        pDVar5[uVar19] =
             pDVar5[uVar19] + (int)((ulong)(*(int *)((long)chip + 200) * lVar12) >> 0x10);
      }
      else {
        cVar7 = *(char *)((long)chip + 0x23);
        if (*(char *)((long)chip + 0x23) < '\x01') {
          cVar7 = '\0';
        }
        cVar15 = *(char *)((long)chip + 0x4b);
        if (cVar15 < '\x01') {
          cVar15 = '\0';
        }
        cVar1 = *(char *)((long)chip + 0x73);
        bVar8 = *(byte *)((long)chip + 0x96);
        if ((char)bVar8 < '\x01') {
          bVar8 = 0;
        }
        cVar2 = *(char *)((long)chip + 0xc2);
        iVar11 = square_lut[(byte)(cVar15 + cVar7)];
        pDVar4[uVar19] = iVar11;
        iVar11 = iVar11 + tnd_lut[(short)(((int)cVar1 - (cVar1 + 0x10 >> 0x1f)) + 0x10U >> 1)]
                          [bVar8][cVar2];
        pDVar4[uVar19] = iVar11;
        pDVar5[uVar19] = iVar11;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != samples);
  }
  return;
}

Assistant:

void nes_apu_update(void* chip, UINT32 samples, DEV_SMPL **outputs)
{
	nesapu_state *info = (nesapu_state*)chip;
	apu_t *apu = &info->APU;
	DEV_SMPL* bufL = outputs[0];
	DEV_SMPL* bufR = outputs[1];
	UINT32 i;

	for (i = 0; i < samples; i++)
	{
		INT16 squ1, squ2, tri, noi, dpcm;

		apu_square(info, &apu->squ[0]);
		apu_square(info, &apu->squ[1]);
		apu_triangle(info, &apu->tri);
		apu_noise(info, &apu->noi);
		apu_dpcm(info, &apu->dpcm);

		if (info->nonlinear_mixing)
		{
			squ1 = (apu->squ[0].output >= 0) ? apu->squ[0].output : 0;
			squ2 = (apu->squ[1].output >= 0) ? apu->squ[1].output : 0;
			tri  = (apu->tri.output + 0x10) / 2;
			noi  = (apu->noi.output >= 0) ? apu->noi.output : 0;
			dpcm = apu->dpcm.output;
			bufL[i] = square_lut[squ1 + squ2];
			bufL[i] += tnd_lut[tri][noi][dpcm];
			bufR[i] = bufL[i];
		}
		else
		{
			// These volumes should match NSFPlay's NES core better
			squ1 = apu->squ[0].output * 0x100;	// [-15..+15] << 8 * 1.0
			squ2 = apu->squ[1].output * 0x100;	// [-15..+15] << 8 * 1.0
			tri  = apu->tri.output * 0xC0;	// [-16..+16] << 8 * 0.75
			noi  = apu->noi.output * 0xC0;	// [-15..+15] << 8 * 0.75
			dpcm = apu->dpcm.output * 0xC0;	// [0..+127] << 8 * 0.75

			bufL[i]  = APPLY_PANNING_S(squ1, apu->squ[0].Pan[0]);
			bufR[i]  = APPLY_PANNING_S(squ1, apu->squ[0].Pan[1]);
			bufL[i] += APPLY_PANNING_S(squ2, apu->squ[1].Pan[0]);
			bufR[i] += APPLY_PANNING_S(squ2, apu->squ[1].Pan[1]);
			bufL[i] += APPLY_PANNING_S(tri, apu->tri.Pan[0]);
			bufR[i] += APPLY_PANNING_S(tri, apu->tri.Pan[1]);
			bufL[i] += APPLY_PANNING_S(noi, apu->noi.Pan[0]);
			bufR[i] += APPLY_PANNING_S(noi, apu->noi.Pan[1]);
			bufL[i] += APPLY_PANNING_L(dpcm, apu->dpcm.Pan[0]);	// could be 0..24384, thus use _L macro
			bufR[i] += APPLY_PANNING_L(dpcm, apu->dpcm.Pan[1]);
		}
	}
}